

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

bufsize_t __thiscall
LdConfigEntryWrapper::getFieldSize(LdConfigEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  size_t count;
  size_t subField_local;
  size_t fieldId_local;
  LdConfigEntryWrapper *this_local;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])();
  if (fieldId < CONCAT44(extraout_var,iVar1)) {
    if (fieldId == 0) {
      this_local = (LdConfigEntryWrapper *)0x4;
    }
    else {
      this_local = (LdConfigEntryWrapper *)0x1;
    }
  }
  else {
    this_local = (LdConfigEntryWrapper *)0x0;
  }
  return (bufsize_t)this_local;
}

Assistant:

bufsize_t LdConfigEntryWrapper::getFieldSize(size_t fieldId, size_t subField)
{
    size_t count = this->getFieldsCount();
    if (fieldId >= count) {
        return 0;
    }
    if (fieldId == HANDLER_ADDR) {
        return sizeof(DWORD);
    }
    return sizeof(BYTE);
}